

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenMemoryFillSetSize(BinaryenExpressionRef expr,BinaryenExpressionRef sizeExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef sizeExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::MemoryFill>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<MemoryFill>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe08,
                  "void BinaryenMemoryFillSetSize(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (sizeExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = sizeExpr;
    return;
  }
  __assert_fail("sizeExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xe09,
                "void BinaryenMemoryFillSetSize(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenMemoryFillSetSize(BinaryenExpressionRef expr,
                               BinaryenExpressionRef sizeExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<MemoryFill>());
  assert(sizeExpr);
  static_cast<MemoryFill*>(expression)->size = (Expression*)sizeExpr;
}